

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

IF97BACKREGIONS IF97::RegionDetermination_HS(double h,double s)

{
  double dVar1;
  double dVar2;
  int iVar3;
  out_of_range *this;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((RegionDetermination_HS(double,double)::b13 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b13), iVar3 != 0)) {
    Backwards::Boundary13HS::Boundary13HS(&RegionDetermination_HS::b13);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::b13,
                 &__dso_handle);
    __cxa_guard_release(&RegionDetermination_HS(double,double)::b13);
  }
  if ((RegionDetermination_HS(double,double)::b23hs == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::b23hs), iVar3 != 0)) {
    Backwards::Boundary23HS::Boundary23HS(&RegionDetermination_HS::b23hs);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::b23hs,
                 &__dso_handle);
    __cxa_guard_release(&RegionDetermination_HS(double,double)::b23hs);
  }
  if ((RegionDetermination_HS(double,double)::R2c == '\0') &&
     (iVar3 = __cxa_guard_acquire(&RegionDetermination_HS(double,double)::R2c), iVar3 != 0)) {
    Backwards::Region2cHS::Region2cHS(&RegionDetermination_HS::R2c);
    __cxa_atexit(Backwards::BackwardsRegion::~BackwardsRegion,&RegionDetermination_HS::R2c,
                 &__dso_handle);
    __cxa_guard_release(&RegionDetermination_HS(double,double)::R2c);
  }
  if ((s < 0.0) || (11.921054825051103 < s)) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Entropy out of range");
  }
  else {
    dVar4 = Hmax(s);
    if ((h <= dVar4) && (dVar4 = Hmin(s), dVar4 <= h)) {
      if (s <= 3.77828134) {
        dVar4 = Backwards::Hsat_s(s);
        if (dVar4 <= h) {
          if (s < 3.397782955) {
            return BACK_1;
          }
          dVar4 = Backwards::BackwardsRegion::h_s
                            (&RegionDetermination_HS::b13.super_BackwardsRegion,s);
          return (uint)(dVar4 <= h) << 2;
        }
      }
      else {
        if (s <= 4.41202148223476) {
          dVar4 = Backwards::Hsat_s(s);
          return (uint)(h < dVar4) * 2 + BACK_3A;
        }
        if (s <= 5.048096828) {
          dVar4 = Backwards::Hsat_s(s);
          return (h < dVar4) + BACK_3B;
        }
        if (s <= 5.260578707) {
          dVar4 = Backwards::Hsat_s(s);
          if (dVar4 <= h) {
            if (h < 2563.592004) {
              return BACK_3B;
            }
            if (2812.942061 < h) {
              return BACK_2C;
            }
            dVar5 = Backwards::BackwardsRegion::t_hs
                              (&RegionDetermination_HS::b23hs.super_BackwardsRegion,h,s);
            dVar4 = region23_n[1];
            dVar1 = *region23_n;
            dVar2 = region23_n[2];
            dVar6 = Backwards::BackwardsRegion::p_hs
                              (&RegionDetermination_HS::R2c.super_BackwardsRegion,h,s);
            return (uint)(dVar2 * dVar5 * dVar5 + dVar4 * dVar5 + dVar1 < dVar6) * 2 + BACK_2C;
          }
        }
        else {
          if (s <= 5.85) {
            dVar4 = Backwards::Hsat_s(s);
            return (uint)(h < dVar4) * 3 + BACK_2C;
          }
          if (9.155492076509681 <= s) {
            return BACK_2A;
          }
          dVar4 = Backwards::Hsat_s(s);
          if (dVar4 <= h) {
            dVar4 = Backwards::H2ab_s(s);
            return (dVar4 < h) + BACK_2A;
          }
        }
      }
      return BACK_4;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Enthalpy out of range");
  }
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline IF97BACKREGIONS RegionDetermination_HS(double h, double s){
        static Backwards::Boundary13HS b13;
        static Backwards::Boundary23HS b23hs;
        static Backwards::Region2cHS R2c;

        // Check Overall Boundaries
        if ( (s < Smin) || (s > Smax) ) 
            throw std::out_of_range("Entropy out of range");
        if ( (h > Hmax(s)) || (h < Hmin(s)) )
            throw std::out_of_range("Enthalpy out of range");

        // ============================================================================
        // Start at the low entropy curves and work our way up.
        // =================================== Region 1 Check =========================
        if (s <= SfT23){
            if (h < Backwards::Hsat_s(s))     //   If below Saturated Liquid Curve
                return BACK_4;                //       REGION 4
            else if (s < S13min)              //   If below H13 Curve
                return BACK_1;                //       REGION 1
            else {                            //   IF within H13 Curve (S13min < s < SfT23)
                if (h < b13.h_s(s))           //       below curve
                    return BACK_1;            //           REGION 1
                else                          //       above curve
                    return BACK_3A;           //           REGION 3 
                 }                            //
        } else if (s <= Scrit){  //========== Region 3a Check (S < Scrit) ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3A;               //      REGION 3(a)
        } else if (s <= S23min){  //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_3B;               //      REGION 3(a)
        } else if (s <= S23max){  //========== Region 3b/2c Check Along B23 Curve ======
            if (h < Backwards::Hsat_s(s))     //  if below Saturated Vapor Curve
                return BACK_4;                //      REGION 4
            else if (h < H23min)              //  if below bounding box
                return BACK_3B;               //      REGION 3(b)
            else if (h > H23max)              //  if above bounding box
                return BACK_2C;               //      REGION 2(c)
            else {                            //  Need to check TB23 Curve
                double TB23 = b23hs.t_hs(h,s);       //  Calc TB23(h,s)
                double PB23 = Region23_T(TB23);      //  Calc Corresponding PB23
                double P    = R2c.p_hs(h,s);         //  Calc P(h,s) using Region 2c
                if (P > PB23)                        //  Above B23 Curve
                    return BACK_3B;                  //      REGION 3(b)
                else                                 //  Below B23 Curve
                    return BACK_2C;                  //      REGION 2(c)
            } 
        } else if (s <= S2bc){   //========== Region 3b Check            ==============
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Liquid Curve
                return BACK_4;                //      REGION 4
            else                              //  If above curve
                return BACK_2C;               //      REGION 2(c)
        } else if (s < Sgtrip) { //========== Region 2a/2b (s > S2bc) above Sat. Curve ==
            if (h < Backwards::Hsat_s(s))     //  If below Saturated Vapor Curve
                return BACK_4;                //      REGION_4
            else {                            //  If above Curve then
                if (h > Backwards::H2ab_s(s))   //      if h > h2ab(s) Curve (P=4 MPa)
                    return BACK_2B;             //          REGION 2(b)
                else                            //      if h < h2ab(s) Curve (P=4 MPa)
                    return BACK_2A;             //          REGION 2(a)
            }
        } else
            return BACK_2A;      //========== Region 2a fall thru ========================
    }